

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_scalar_txt(REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char *separator,char *filename)

{
  REF_NODE ref_node_00;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  char *separator_local;
  REF_DBL *scalar_local;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_grid_local._4_4_ = ref_node_synchronize_globals(ref_node_00);
  if (ref_grid_local._4_4_ == 0) {
    ref_node = (REF_NODE)0x0;
    if ((ref_grid->mpi->id == 0) &&
       (ref_node = (REF_NODE)fopen(filename,"w"), (FILE *)ref_node == (FILE *)0x0)) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xbd7,"ref_gather_scalar_txt","unable to open file");
      ref_grid_local._4_4_ = 2;
    }
    else {
      ref_grid_local._4_4_ =
           ref_gather_node_scalar_txt(ref_node_00,ldim,scalar,separator,0,(FILE *)ref_node);
      if (ref_grid_local._4_4_ == 0) {
        if (ref_grid->mpi->id == 0) {
          fclose((FILE *)ref_node);
        }
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xbdc,"ref_gather_scalar_txt",(ulong)ref_grid_local._4_4_,"nodes");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xbd1,
           "ref_gather_scalar_txt",(ulong)ref_grid_local._4_4_,"sync");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_scalar_txt(REF_GRID ref_grid, REF_INT ldim,
                                                REF_DBL *scalar,
                                                const char *separator,
                                                const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
  }

  RSS(ref_gather_node_scalar_txt(ref_node, ldim, scalar, separator, REF_FALSE,
                                 file),
      "nodes");

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}